

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O1

function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *
mxx::attr_map<int,_std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>_>::get
          (MPI_Datatype *dt,int *k)

{
  int iVar1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmVar2;
  _Base_ptr p_Var3;
  mapped_type *pmVar4;
  out_of_range *poVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  int flag;
  function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *result;
  int local_24;
  function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *local_20;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)
                             attr_map<int,std::function<void(void*,void*,int*,ompi_datatype_t**)>>::
                             mut()::m);
  if (iVar1 == 0) {
    pmVar2 = keymap();
    p_Var6 = (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var7 = &(pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var3 = p_Var7;
    if (p_Var6 != (_Base_ptr)0x0) {
      do {
        if (*k <= (int)p_Var6[1]._M_color) {
          p_Var3 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < *k];
      } while (p_Var6 != (_Base_ptr)0x0);
    }
    if ((p_Var3 != p_Var7) && ((int)p_Var3[1]._M_color <= *k)) {
      p_Var7 = p_Var3;
    }
    pmVar2 = keymap();
    if ((_Rb_tree_header *)p_Var7 != &(pmVar2->_M_t)._M_impl.super__Rb_tree_header) {
      pmVar2 = keymap();
      pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](pmVar2,k);
      MPI_Type_get_attr(*dt,*pmVar4,&local_20,&local_24);
      if (local_24 != 0) {
        pthread_mutex_unlock
                  ((pthread_mutex_t *)
                   attr_map<int,std::function<void(void*,void*,int*,ompi_datatype_t**)>>::mut()::m);
        return local_20;
      }
      poVar5 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(poVar5,"Key not mapped.");
      __cxa_throw(poVar5,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
  }
  else {
    std::__throw_system_error(iVar1);
  }
  poVar5 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(poVar5,"Key not mapped.");
  __cxa_throw(poVar5,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

static T& get(const MPI_Datatype& dt, const K& k) {
        std::lock_guard<std::mutex> lock(mut());
        if (keymap().find(k) == keymap().end()) {
            throw std::out_of_range("Key not mapped.");
        }
        int key = keymap()[k];
        T* result;
        int flag;
        MPI_Type_get_attr(dt, key, &result, &flag);
        if (!flag) {
            throw std::out_of_range("Key not mapped.");
        }
        return *result;
    }